

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool print_object(cJSON *item,printbuffer *output_buffer)

{
  int iVar1;
  cJSON_bool cVar2;
  uchar *puVar3;
  long lVar4;
  size_t local_58;
  ulong local_48;
  size_t i_1;
  size_t i;
  cJSON *current_item;
  size_t length;
  uchar *output_pointer;
  printbuffer *output_buffer_local;
  cJSON *item_local;
  
  i = (size_t)item->child;
  if (output_buffer == (printbuffer *)0x0) {
    item_local._4_4_ = 0;
  }
  else {
    iVar1 = 1;
    if (output_buffer->format != 0) {
      iVar1 = 2;
    }
    puVar3 = ensure(output_buffer,(long)iVar1 + 1);
    if (puVar3 == (uchar *)0x0) {
      item_local._4_4_ = 0;
    }
    else {
      *puVar3 = '{';
      output_buffer->depth = output_buffer->depth + 1;
      if (output_buffer->format != 0) {
        puVar3[1] = '\n';
      }
      output_buffer->offset = (long)iVar1 + output_buffer->offset;
      for (; i != 0; i = *(size_t *)i) {
        if (output_buffer->format != 0) {
          length = (size_t)ensure(output_buffer,output_buffer->depth);
          if ((uchar *)length == (uchar *)0x0) {
            return 0;
          }
          for (i_1 = 0; i_1 < output_buffer->depth; i_1 = i_1 + 1) {
            *(undefined1 *)length = 9;
            length = length + 1;
          }
          output_buffer->offset = output_buffer->depth + output_buffer->offset;
        }
        cVar2 = print_string_ptr(*(uchar **)(i + 0x38),output_buffer);
        if (cVar2 == 0) {
          return 0;
        }
        update_offset(output_buffer);
        iVar1 = 1;
        if (output_buffer->format != 0) {
          iVar1 = 2;
        }
        puVar3 = ensure(output_buffer,(long)iVar1);
        if (puVar3 == (uchar *)0x0) {
          return 0;
        }
        *puVar3 = ':';
        if (output_buffer->format != 0) {
          puVar3[1] = '\t';
        }
        output_buffer->offset = (long)iVar1 + output_buffer->offset;
        cVar2 = print_value((cJSON *)i,output_buffer);
        if (cVar2 == 0) {
          return 0;
        }
        update_offset(output_buffer);
        lVar4 = (long)(int)(uint)(output_buffer->format != 0) + (long)(int)(uint)(*(long *)i != 0);
        puVar3 = ensure(output_buffer,lVar4 + 1);
        if (puVar3 == (uchar *)0x0) {
          return 0;
        }
        length = (size_t)puVar3;
        if (*(long *)i != 0) {
          length = (size_t)(puVar3 + 1);
          *puVar3 = ',';
        }
        if (output_buffer->format != 0) {
          *(undefined1 *)length = 10;
          length = length + 1;
        }
        *(undefined1 *)length = 0;
        output_buffer->offset = lVar4 + output_buffer->offset;
      }
      if (output_buffer->format == 0) {
        local_58 = 2;
      }
      else {
        local_58 = output_buffer->depth + 1;
      }
      length = (size_t)ensure(output_buffer,local_58);
      if ((uchar *)length == (uchar *)0x0) {
        item_local._4_4_ = 0;
      }
      else {
        if (output_buffer->format != 0) {
          for (local_48 = 0; local_48 < output_buffer->depth - 1; local_48 = local_48 + 1) {
            *(undefined1 *)length = 9;
            length = length + 1;
          }
        }
        *(undefined1 *)length = 0x7d;
        *(undefined1 *)(length + 1) = 0;
        output_buffer->depth = output_buffer->depth - 1;
        item_local._4_4_ = 1;
      }
    }
  }
  return item_local._4_4_;
}

Assistant:

static cJSON_bool print_object(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    size_t length = 0;
    cJSON *current_item = item->child;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* Compose the output: */
    length = (size_t) (output_buffer->format ? 2 : 1); /* fmt: {\n */
    output_pointer = ensure(output_buffer, length + 1);
    if (output_pointer == NULL)
    {
        return false;
    }

    *output_pointer++ = '{';
    output_buffer->depth++;
    if (output_buffer->format)
    {
        *output_pointer++ = '\n';
    }
    output_buffer->offset += length;

    while (current_item)
    {
        if (output_buffer->format)
        {
            size_t i;
            output_pointer = ensure(output_buffer, output_buffer->depth);
            if (output_pointer == NULL)
            {
                return false;
            }
            for (i = 0; i < output_buffer->depth; i++)
            {
                *output_pointer++ = '\t';
            }
            output_buffer->offset += output_buffer->depth;
        }

        /* print key */
        if (!print_string_ptr((unsigned char*)current_item->string, output_buffer))
        {
            return false;
        }
        update_offset(output_buffer);

        length = (size_t) (output_buffer->format ? 2 : 1);
        output_pointer = ensure(output_buffer, length);
        if (output_pointer == NULL)
        {
            return false;
        }
        *output_pointer++ = ':';
        if (output_buffer->format)
        {
            *output_pointer++ = '\t';
        }
        output_buffer->offset += length;

        /* print value */
        if (!print_value(current_item, output_buffer))
        {
            return false;
        }
        update_offset(output_buffer);

        /* print comma if not last */
        length = ((size_t)(output_buffer->format ? 1 : 0) + (size_t)(current_item->next ? 1 : 0));
        output_pointer = ensure(output_buffer, length + 1);
        if (output_pointer == NULL)
        {
            return false;
        }
        if (current_item->next)
        {
            *output_pointer++ = ',';
        }

        if (output_buffer->format)
        {
            *output_pointer++ = '\n';
        }
        *output_pointer = '\0';
        output_buffer->offset += length;

        current_item = current_item->next;
    }

    output_pointer = ensure(output_buffer, output_buffer->format ? (output_buffer->depth + 1) : 2);
    if (output_pointer == NULL)
    {
        return false;
    }
    if (output_buffer->format)
    {
        size_t i;
        for (i = 0; i < (output_buffer->depth - 1); i++)
        {
            *output_pointer++ = '\t';
        }
    }
    *output_pointer++ = '}';
    *output_pointer = '\0';
    output_buffer->depth--;

    return true;
}